

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O1

void embree::avx::
     BVHNIntersector1<4,_1,_false,_embree::avx::ArrayIntersector1<embree::avx::TriangleMiIntersector1Moeller<4,_true>_>_>
     ::occluded(Intersectors *This,Ray *ray,RayQueryContext *context)

{
  undefined8 *puVar1;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar2;
  float **ppfVar3;
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  float *pfVar7;
  undefined1 auVar8 [16];
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  bool bVar31;
  undefined1 auVar32 [16];
  undefined4 uVar33;
  ulong uVar34;
  long lVar35;
  ulong uVar36;
  uint uVar37;
  ulong uVar38;
  ulong uVar39;
  ulong uVar40;
  ulong uVar41;
  ulong uVar42;
  ulong uVar43;
  NodeRef *pNVar44;
  ulong unaff_R12;
  size_t mask;
  int iVar45;
  bool bVar46;
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  float fVar52;
  float fVar64;
  float fVar65;
  vint4 bi;
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  float fVar66;
  vint4 ai;
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  float fVar79;
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  float fVar84;
  float fVar86;
  float fVar87;
  undefined1 auVar85 [16];
  float fVar88;
  uint uVar89;
  uint uVar90;
  uint uVar91;
  float fVar92;
  float fVar95;
  float fVar96;
  float fVar97;
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  float fVar98;
  float fVar101;
  float fVar102;
  float fVar103;
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  int local_a4c;
  undefined1 local_a48 [16];
  ulong local_a30;
  ulong local_a28;
  ulong local_a20;
  ulong local_a18;
  Scene *scene;
  undefined1 local_a08 [16];
  undefined1 local_9f8 [16];
  undefined1 local_9e8 [16];
  Geometry *local_9d0;
  ulong local_9c8;
  ulong local_9c0;
  ulong local_9b8;
  ulong local_9b0;
  HitK<1> h;
  RTCFilterFunctionNArguments args;
  undefined8 local_8b8;
  undefined8 uStack_8b0;
  undefined8 local_8a8;
  undefined8 uStack_8a0;
  undefined1 local_898 [16];
  undefined1 local_888 [16];
  undefined1 local_878 [16];
  undefined1 local_868 [16];
  undefined1 local_848 [16];
  undefined1 local_838 [16];
  undefined1 local_828 [16];
  float local_818 [4];
  undefined1 local_808 [16];
  undefined1 local_7f8 [16];
  undefined8 local_7e8;
  undefined8 uStack_7e0;
  NodeRef stack [244];
  
  auVar32 = mm_lookupmask_ps._240_16_;
  if (*(long *)&This->ptr[1].bounds.bounds0.lower.field_0 != 8) {
    fVar52 = ray->tfar;
    if (0.0 <= fVar52) {
      pNVar44 = stack + 1;
      stack[0].ptr = *(size_t *)&This->ptr[1].bounds.bounds0.lower.field_0;
      auVar8 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->org).field_0.m128[3]));
      aVar2 = (ray->dir).field_0;
      auVar78._8_4_ = 0x7fffffff;
      auVar78._0_8_ = 0x7fffffff7fffffff;
      auVar78._12_4_ = 0x7fffffff;
      auVar78 = vandps_avx((undefined1  [16])aVar2,auVar78);
      auVar80._8_4_ = 0x219392ef;
      auVar80._0_8_ = 0x219392ef219392ef;
      auVar80._12_4_ = 0x219392ef;
      auVar78 = vcmpps_avx(auVar78,auVar80,1);
      auVar78 = vblendvps_avx((undefined1  [16])aVar2,auVar80,auVar78);
      auVar80 = vrcpps_avx(auVar78);
      fVar64 = auVar80._0_4_;
      auVar74._0_4_ = fVar64 * auVar78._0_4_;
      fVar65 = auVar80._4_4_;
      auVar74._4_4_ = fVar65 * auVar78._4_4_;
      fVar66 = auVar80._8_4_;
      auVar74._8_4_ = fVar66 * auVar78._8_4_;
      fVar79 = auVar80._12_4_;
      auVar74._12_4_ = fVar79 * auVar78._12_4_;
      auVar81._8_4_ = 0x3f800000;
      auVar81._0_8_ = &DAT_3f8000003f800000;
      auVar81._12_4_ = 0x3f800000;
      auVar78 = vsubps_avx(auVar81,auVar74);
      auVar75._0_4_ = fVar64 + fVar64 * auVar78._0_4_;
      auVar75._4_4_ = fVar65 + fVar65 * auVar78._4_4_;
      auVar75._8_4_ = fVar66 + fVar66 * auVar78._8_4_;
      auVar75._12_4_ = fVar79 + fVar79 * auVar78._12_4_;
      uVar33 = *(undefined4 *)&(ray->org).field_0;
      auVar82._4_4_ = uVar33;
      auVar82._0_4_ = uVar33;
      auVar82._8_4_ = uVar33;
      auVar82._12_4_ = uVar33;
      uVar33 = *(undefined4 *)((long)&(ray->org).field_0 + 4);
      auVar83._4_4_ = uVar33;
      auVar83._0_4_ = uVar33;
      auVar83._8_4_ = uVar33;
      auVar83._12_4_ = uVar33;
      uVar33 = *(undefined4 *)((long)&(ray->org).field_0 + 8);
      auVar85._4_4_ = uVar33;
      auVar85._0_4_ = uVar33;
      auVar85._8_4_ = uVar33;
      auVar85._12_4_ = uVar33;
      auVar74 = vshufps_avx(auVar75,auVar75,0);
      auVar78 = vmovshdup_avx(auVar75);
      auVar81 = vshufps_avx(auVar75,auVar75,0x55);
      auVar80 = vshufpd_avx(auVar75,auVar75,1);
      local_9b8 = (ulong)(auVar75._0_4_ < 0.0) << 4;
      auVar75 = vshufps_avx(auVar75,auVar75,0xaa);
      local_9c0 = (ulong)(auVar78._0_4_ < 0.0) << 4 | 0x20;
      uVar42 = (ulong)(auVar80._0_4_ < 0.0) << 4 | 0x40;
      uVar43 = local_9b8 ^ 0x10;
      uVar41 = local_9c0 ^ 0x10;
      uVar36 = uVar42 ^ 0x10;
      auVar78 = vshufps_avx(auVar8,auVar8,0);
      auVar8 = vshufps_avx(ZEXT416((uint)fVar52),ZEXT416((uint)fVar52),0);
      local_a30 = uVar36;
      local_a28 = uVar41;
      local_a20 = uVar43;
      local_a18 = uVar42;
      do {
        if (pNVar44 == stack) {
          return;
        }
        uVar40 = pNVar44[-1].ptr;
        pNVar44 = pNVar44 + -1;
        do {
          if ((uVar40 & 8) == 0) {
            auVar80 = vsubps_avx(*(undefined1 (*) [16])(uVar40 + 0x20 + local_9b8),auVar82);
            auVar47._0_4_ = auVar74._0_4_ * auVar80._0_4_;
            auVar47._4_4_ = auVar74._4_4_ * auVar80._4_4_;
            auVar47._8_4_ = auVar74._8_4_ * auVar80._8_4_;
            auVar47._12_4_ = auVar74._12_4_ * auVar80._12_4_;
            auVar80 = vsubps_avx(*(undefined1 (*) [16])(uVar40 + 0x20 + local_9c0),auVar83);
            auVar53._0_4_ = auVar81._0_4_ * auVar80._0_4_;
            auVar53._4_4_ = auVar81._4_4_ * auVar80._4_4_;
            auVar53._8_4_ = auVar81._8_4_ * auVar80._8_4_;
            auVar53._12_4_ = auVar81._12_4_ * auVar80._12_4_;
            auVar80 = vpmaxsd_avx(auVar47,auVar53);
            auVar47 = vsubps_avx(*(undefined1 (*) [16])(uVar40 + 0x20 + uVar42),auVar85);
            auVar54._0_4_ = auVar75._0_4_ * auVar47._0_4_;
            auVar54._4_4_ = auVar75._4_4_ * auVar47._4_4_;
            auVar54._8_4_ = auVar75._8_4_ * auVar47._8_4_;
            auVar54._12_4_ = auVar75._12_4_ * auVar47._12_4_;
            auVar47 = vpmaxsd_avx(auVar54,auVar78);
            auVar80 = vpmaxsd_avx(auVar80,auVar47);
            auVar47 = vsubps_avx(*(undefined1 (*) [16])(uVar40 + 0x20 + uVar43),auVar82);
            auVar55._0_4_ = auVar74._0_4_ * auVar47._0_4_;
            auVar55._4_4_ = auVar74._4_4_ * auVar47._4_4_;
            auVar55._8_4_ = auVar74._8_4_ * auVar47._8_4_;
            auVar55._12_4_ = auVar74._12_4_ * auVar47._12_4_;
            auVar47 = vsubps_avx(*(undefined1 (*) [16])(uVar40 + 0x20 + uVar41),auVar83);
            auVar67._0_4_ = auVar81._0_4_ * auVar47._0_4_;
            auVar67._4_4_ = auVar81._4_4_ * auVar47._4_4_;
            auVar67._8_4_ = auVar81._8_4_ * auVar47._8_4_;
            auVar67._12_4_ = auVar81._12_4_ * auVar47._12_4_;
            auVar47 = vpminsd_avx(auVar55,auVar67);
            auVar53 = vsubps_avx(*(undefined1 (*) [16])(uVar40 + 0x20 + uVar36),auVar85);
            auVar68._0_4_ = auVar75._0_4_ * auVar53._0_4_;
            auVar68._4_4_ = auVar75._4_4_ * auVar53._4_4_;
            auVar68._8_4_ = auVar75._8_4_ * auVar53._8_4_;
            auVar68._12_4_ = auVar75._12_4_ * auVar53._12_4_;
            auVar53 = vpminsd_avx(auVar68,auVar8);
            auVar47 = vpminsd_avx(auVar47,auVar53);
            auVar80 = vpcmpgtd_avx(auVar80,auVar47);
            uVar33 = vmovmskps_avx(auVar80);
            unaff_R12 = (ulong)(byte)((byte)uVar33 ^ 0xf);
          }
          if ((uVar40 & 8) == 0) {
            if (unaff_R12 == 0) {
              iVar45 = 4;
            }
            else {
              uVar39 = uVar40 & 0xfffffffffffffff0;
              lVar35 = 0;
              if (unaff_R12 != 0) {
                for (; (unaff_R12 >> lVar35 & 1) == 0; lVar35 = lVar35 + 1) {
                }
              }
              iVar45 = 0;
              uVar40 = *(ulong *)(uVar39 + lVar35 * 8);
              uVar38 = unaff_R12 - 1 & unaff_R12;
              if (uVar38 != 0) {
                pNVar44->ptr = uVar40;
                lVar35 = 0;
                if (uVar38 != 0) {
                  for (; (uVar38 >> lVar35 & 1) == 0; lVar35 = lVar35 + 1) {
                  }
                }
                uVar34 = uVar38 - 1;
                while( true ) {
                  pNVar44 = pNVar44 + 1;
                  uVar40 = *(ulong *)(uVar39 + lVar35 * 8);
                  uVar34 = uVar34 & uVar38;
                  if (uVar34 == 0) break;
                  pNVar44->ptr = uVar40;
                  lVar35 = 0;
                  if (uVar34 != 0) {
                    for (; (uVar34 >> lVar35 & 1) == 0; lVar35 = lVar35 + 1) {
                    }
                  }
                  uVar38 = uVar34 - 1;
                }
              }
            }
          }
          else {
            iVar45 = 6;
          }
        } while (iVar45 == 0);
        if (iVar45 == 6) {
          iVar45 = 0;
          local_9b0 = (ulong)((uint)uVar40 & 0xf) - 8;
          bVar46 = local_9b0 != 0;
          if (bVar46) {
            uVar40 = uVar40 & 0xfffffffffffffff0;
            scene = context->scene;
            uVar39 = 0;
            do {
              lVar35 = uVar39 * 0x50;
              ppfVar3 = (scene->vertices).items;
              pfVar4 = ppfVar3[*(uint *)(uVar40 + 0x30 + lVar35)];
              pfVar5 = ppfVar3[*(uint *)(uVar40 + 0x34 + lVar35)];
              pfVar6 = ppfVar3[*(uint *)(uVar40 + 0x38 + lVar35)];
              pfVar7 = ppfVar3[*(uint *)(uVar40 + 0x3c + lVar35)];
              auVar53 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar4 + *(uint *)(uVar40 + lVar35)),
                                      *(undefined1 (*) [16])
                                       (pfVar6 + *(uint *)(uVar40 + 8 + lVar35)));
              auVar80 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar4 + *(uint *)(uVar40 + lVar35)),
                                      *(undefined1 (*) [16])
                                       (pfVar6 + *(uint *)(uVar40 + 8 + lVar35)));
              auVar54 = vunpcklps_avx(*(undefined1 (*) [16])
                                       (pfVar5 + *(uint *)(uVar40 + 4 + lVar35)),
                                      *(undefined1 (*) [16])
                                       (pfVar7 + *(uint *)(uVar40 + 0xc + lVar35)));
              auVar47 = vunpckhps_avx(*(undefined1 (*) [16])
                                       (pfVar5 + *(uint *)(uVar40 + 4 + lVar35)),
                                      *(undefined1 (*) [16])
                                       (pfVar7 + *(uint *)(uVar40 + 0xc + lVar35)));
              auVar67 = vunpcklps_avx(auVar80,auVar47);
              auVar68 = vunpcklps_avx(auVar53,auVar54);
              auVar55 = vunpckhps_avx(auVar53,auVar54);
              auVar53 = vunpcklps_avx(*(undefined1 (*) [16])
                                       (pfVar4 + *(uint *)(uVar40 + 0x10 + lVar35)),
                                      *(undefined1 (*) [16])
                                       (pfVar6 + *(uint *)(uVar40 + 0x18 + lVar35)));
              auVar80 = vunpckhps_avx(*(undefined1 (*) [16])
                                       (pfVar4 + *(uint *)(uVar40 + 0x10 + lVar35)),
                                      *(undefined1 (*) [16])
                                       (pfVar6 + *(uint *)(uVar40 + 0x18 + lVar35)));
              auVar54 = vunpcklps_avx(*(undefined1 (*) [16])
                                       (pfVar5 + *(uint *)(uVar40 + 0x14 + lVar35)),
                                      *(undefined1 (*) [16])
                                       (pfVar7 + *(uint *)(uVar40 + 0x1c + lVar35)));
              auVar47 = vunpckhps_avx(*(undefined1 (*) [16])
                                       (pfVar5 + *(uint *)(uVar40 + 0x14 + lVar35)),
                                      *(undefined1 (*) [16])
                                       (pfVar7 + *(uint *)(uVar40 + 0x1c + lVar35)));
              auVar48 = vunpcklps_avx(auVar80,auVar47);
              auVar49 = vunpcklps_avx(auVar53,auVar54);
              auVar80 = vunpckhps_avx(auVar53,auVar54);
              auVar54 = vunpcklps_avx(*(undefined1 (*) [16])
                                       (pfVar4 + *(uint *)(uVar40 + 0x20 + lVar35)),
                                      *(undefined1 (*) [16])
                                       (pfVar6 + *(uint *)(uVar40 + 0x28 + lVar35)));
              auVar47 = vunpckhps_avx(*(undefined1 (*) [16])
                                       (pfVar4 + *(uint *)(uVar40 + 0x20 + lVar35)),
                                      *(undefined1 (*) [16])
                                       (pfVar6 + *(uint *)(uVar40 + 0x28 + lVar35)));
              auVar50 = vunpcklps_avx(*(undefined1 (*) [16])
                                       (pfVar5 + *(uint *)(uVar40 + 0x24 + lVar35)),
                                      *(undefined1 (*) [16])
                                       (pfVar7 + *(uint *)(uVar40 + 0x2c + lVar35)));
              auVar53 = vunpckhps_avx(*(undefined1 (*) [16])
                                       (pfVar5 + *(uint *)(uVar40 + 0x24 + lVar35)),
                                      *(undefined1 (*) [16])
                                       (pfVar7 + *(uint *)(uVar40 + 0x2c + lVar35)));
              auVar56 = vunpcklps_avx(auVar47,auVar53);
              auVar47 = vunpcklps_avx(auVar54,auVar50);
              auVar53 = vunpckhps_avx(auVar54,auVar50);
              puVar1 = (undefined8 *)(uVar40 + 0x30 + lVar35);
              local_8a8 = *puVar1;
              uStack_8a0 = puVar1[1];
              puVar1 = (undefined8 *)(uVar40 + 0x40 + lVar35);
              local_8b8 = *puVar1;
              uStack_8b0 = puVar1[1];
              local_a48 = vsubps_avx(auVar68,auVar49);
              local_9f8 = vsubps_avx(auVar55,auVar80);
              auVar80 = vsubps_avx(auVar67,auVar48);
              auVar47 = vsubps_avx(auVar47,auVar68);
              auVar53 = vsubps_avx(auVar53,auVar55);
              auVar54 = vsubps_avx(auVar56,auVar67);
              fVar66 = auVar54._0_4_;
              fVar98 = local_9f8._0_4_;
              auVar48._0_4_ = fVar98 * fVar66;
              fVar13 = auVar54._4_4_;
              fVar101 = local_9f8._4_4_;
              auVar48._4_4_ = fVar101 * fVar13;
              fVar19 = auVar54._8_4_;
              fVar102 = local_9f8._8_4_;
              auVar48._8_4_ = fVar102 * fVar19;
              fVar25 = auVar54._12_4_;
              fVar103 = local_9f8._12_4_;
              auVar48._12_4_ = fVar103 * fVar25;
              fVar79 = auVar53._0_4_;
              fVar84 = auVar80._0_4_;
              auVar56._0_4_ = fVar84 * fVar79;
              fVar14 = auVar53._4_4_;
              fVar86 = auVar80._4_4_;
              auVar56._4_4_ = fVar86 * fVar14;
              fVar20 = auVar53._8_4_;
              fVar87 = auVar80._8_4_;
              auVar56._8_4_ = fVar87 * fVar20;
              fVar26 = auVar53._12_4_;
              fVar88 = auVar80._12_4_;
              auVar56._12_4_ = fVar88 * fVar26;
              local_808 = vsubps_avx(auVar56,auVar48);
              fVar9 = auVar47._0_4_;
              auVar57._0_4_ = fVar84 * fVar9;
              fVar15 = auVar47._4_4_;
              auVar57._4_4_ = fVar86 * fVar15;
              fVar21 = auVar47._8_4_;
              auVar57._8_4_ = fVar87 * fVar21;
              fVar27 = auVar47._12_4_;
              auVar57._12_4_ = fVar88 * fVar27;
              fVar92 = local_a48._0_4_;
              auVar69._0_4_ = fVar92 * fVar66;
              fVar95 = local_a48._4_4_;
              auVar69._4_4_ = fVar95 * fVar13;
              fVar96 = local_a48._8_4_;
              auVar69._8_4_ = fVar96 * fVar19;
              fVar97 = local_a48._12_4_;
              auVar69._12_4_ = fVar97 * fVar25;
              local_7f8 = vsubps_avx(auVar69,auVar57);
              auVar70._0_4_ = fVar92 * fVar79;
              auVar70._4_4_ = fVar95 * fVar14;
              auVar70._8_4_ = fVar96 * fVar20;
              auVar70._12_4_ = fVar97 * fVar26;
              auVar76._0_4_ = fVar98 * fVar9;
              auVar76._4_4_ = fVar101 * fVar15;
              auVar76._8_4_ = fVar102 * fVar21;
              auVar76._12_4_ = fVar103 * fVar27;
              local_a08 = vsubps_avx(auVar76,auVar70);
              uVar33 = *(undefined4 *)&(ray->org).field_0;
              auVar49._4_4_ = uVar33;
              auVar49._0_4_ = uVar33;
              auVar49._8_4_ = uVar33;
              auVar49._12_4_ = uVar33;
              uVar33 = *(undefined4 *)((long)&(ray->org).field_0 + 4);
              auVar93._4_4_ = uVar33;
              auVar93._0_4_ = uVar33;
              auVar93._8_4_ = uVar33;
              auVar93._12_4_ = uVar33;
              uVar33 = *(undefined4 *)((long)&(ray->org).field_0 + 8);
              auVar99._4_4_ = uVar33;
              auVar99._0_4_ = uVar33;
              auVar99._8_4_ = uVar33;
              auVar99._12_4_ = uVar33;
              fVar52 = (ray->dir).field_0.m128[1];
              local_9e8 = vsubps_avx(auVar68,auVar49);
              fVar64 = (ray->dir).field_0.m128[2];
              auVar80 = vsubps_avx(auVar55,auVar93);
              auVar47 = vsubps_avx(auVar67,auVar99);
              fVar10 = auVar47._0_4_;
              auVar94._0_4_ = fVar52 * fVar10;
              fVar16 = auVar47._4_4_;
              auVar94._4_4_ = fVar52 * fVar16;
              fVar22 = auVar47._8_4_;
              auVar94._8_4_ = fVar52 * fVar22;
              fVar28 = auVar47._12_4_;
              auVar94._12_4_ = fVar52 * fVar28;
              fVar11 = auVar80._0_4_;
              auVar100._0_4_ = fVar64 * fVar11;
              fVar17 = auVar80._4_4_;
              auVar100._4_4_ = fVar64 * fVar17;
              fVar23 = auVar80._8_4_;
              auVar100._8_4_ = fVar64 * fVar23;
              fVar29 = auVar80._12_4_;
              auVar100._12_4_ = fVar64 * fVar29;
              auVar47 = vsubps_avx(auVar100,auVar94);
              fVar65 = (ray->dir).field_0.m128[0];
              fVar12 = local_9e8._0_4_;
              auVar50._0_4_ = fVar64 * fVar12;
              fVar18 = local_9e8._4_4_;
              auVar50._4_4_ = fVar64 * fVar18;
              fVar24 = local_9e8._8_4_;
              auVar50._8_4_ = fVar64 * fVar24;
              fVar30 = local_9e8._12_4_;
              auVar50._12_4_ = fVar64 * fVar30;
              auVar58._0_4_ = fVar65 * fVar10;
              auVar58._4_4_ = fVar65 * fVar16;
              auVar58._8_4_ = fVar65 * fVar22;
              auVar58._12_4_ = fVar65 * fVar28;
              auVar53 = vsubps_avx(auVar58,auVar50);
              auVar59._0_4_ = fVar65 * fVar11;
              auVar59._4_4_ = fVar65 * fVar17;
              auVar59._8_4_ = fVar65 * fVar23;
              auVar59._12_4_ = fVar65 * fVar29;
              auVar71._0_4_ = fVar52 * fVar12;
              auVar71._4_4_ = fVar52 * fVar18;
              auVar71._8_4_ = fVar52 * fVar24;
              auVar71._12_4_ = fVar52 * fVar30;
              auVar54 = vsubps_avx(auVar71,auVar59);
              auVar72._0_4_ =
                   fVar65 * local_808._0_4_ + fVar52 * local_7f8._0_4_ + fVar64 * local_a08._0_4_;
              auVar72._4_4_ =
                   fVar65 * local_808._4_4_ + fVar52 * local_7f8._4_4_ + fVar64 * local_a08._4_4_;
              auVar72._8_4_ =
                   fVar65 * local_808._8_4_ + fVar52 * local_7f8._8_4_ + fVar64 * local_a08._8_4_;
              auVar72._12_4_ =
                   fVar65 * local_808._12_4_ + fVar52 * local_7f8._12_4_ + fVar64 * local_a08._12_4_
              ;
              auVar60._8_8_ = 0x8000000080000000;
              auVar60._0_8_ = 0x8000000080000000;
              auVar80 = vandps_avx(auVar72,auVar60);
              uVar37 = auVar80._0_4_;
              local_898._0_4_ =
                   (float)(uVar37 ^ (uint)(fVar9 * auVar47._0_4_ +
                                          fVar79 * auVar53._0_4_ + fVar66 * auVar54._0_4_));
              uVar89 = auVar80._4_4_;
              local_898._4_4_ =
                   (float)(uVar89 ^ (uint)(fVar15 * auVar47._4_4_ +
                                          fVar14 * auVar53._4_4_ + fVar13 * auVar54._4_4_));
              uVar90 = auVar80._8_4_;
              local_898._8_4_ =
                   (float)(uVar90 ^ (uint)(fVar21 * auVar47._8_4_ +
                                          fVar20 * auVar53._8_4_ + fVar19 * auVar54._8_4_));
              uVar91 = auVar80._12_4_;
              local_898._12_4_ =
                   (float)(uVar91 ^ (uint)(fVar27 * auVar47._12_4_ +
                                          fVar26 * auVar53._12_4_ + fVar25 * auVar54._12_4_));
              local_888._0_4_ =
                   (float)(uVar37 ^ (uint)(auVar47._0_4_ * fVar92 +
                                          auVar53._0_4_ * fVar98 + fVar84 * auVar54._0_4_));
              local_888._4_4_ =
                   (float)(uVar89 ^ (uint)(auVar47._4_4_ * fVar95 +
                                          auVar53._4_4_ * fVar101 + fVar86 * auVar54._4_4_));
              local_888._8_4_ =
                   (float)(uVar90 ^ (uint)(auVar47._8_4_ * fVar96 +
                                          auVar53._8_4_ * fVar102 + fVar87 * auVar54._8_4_));
              local_888._12_4_ =
                   (float)(uVar91 ^ (uint)(auVar47._12_4_ * fVar97 +
                                          auVar53._12_4_ * fVar103 + fVar88 * auVar54._12_4_));
              auVar53 = ZEXT416(0) << 0x20;
              auVar80 = vcmpps_avx(local_898,auVar53,5);
              auVar47 = vcmpps_avx(local_888,auVar53,5);
              auVar80 = vandps_avx(auVar80,auVar47);
              auVar61._8_4_ = 0x7fffffff;
              auVar61._0_8_ = 0x7fffffff7fffffff;
              auVar61._12_4_ = 0x7fffffff;
              local_868 = vandps_avx(auVar72,auVar61);
              auVar47 = vcmpps_avx(auVar53,auVar72,4);
              auVar80 = vandps_avx(auVar80,auVar47);
              auVar62._0_4_ = local_888._0_4_ + local_898._0_4_;
              auVar62._4_4_ = local_888._4_4_ + local_898._4_4_;
              auVar62._8_4_ = local_888._8_4_ + local_898._8_4_;
              auVar62._12_4_ = local_888._12_4_ + local_898._12_4_;
              auVar47 = vcmpps_avx(auVar62,local_868,2);
              auVar80 = vandps_avx(auVar80,auVar47);
              auVar47 = auVar32 & auVar80;
              if ((((auVar47 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                   (auVar47 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar47 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  auVar47[0xf] < '\0') {
                auVar80 = vandps_avx(auVar80,auVar32);
                local_878._0_4_ =
                     (float)(uVar37 ^ (uint)(local_808._0_4_ * fVar12 +
                                            local_7f8._0_4_ * fVar11 + fVar10 * local_a08._0_4_));
                local_878._4_4_ =
                     (float)(uVar89 ^ (uint)(local_808._4_4_ * fVar18 +
                                            local_7f8._4_4_ * fVar17 + fVar16 * local_a08._4_4_));
                local_878._8_4_ =
                     (float)(uVar90 ^ (uint)(local_808._8_4_ * fVar24 +
                                            local_7f8._8_4_ * fVar23 + fVar22 * local_a08._8_4_));
                local_878._12_4_ =
                     (float)(uVar91 ^ (uint)(local_808._12_4_ * fVar30 +
                                            local_7f8._12_4_ * fVar29 + fVar28 * local_a08._12_4_));
                fVar52 = (ray->org).field_0.m128[3];
                fVar64 = local_868._0_4_;
                auVar51._0_4_ = fVar64 * fVar52;
                fVar65 = local_868._4_4_;
                auVar51._4_4_ = fVar65 * fVar52;
                fVar66 = local_868._8_4_;
                auVar51._8_4_ = fVar66 * fVar52;
                fVar79 = local_868._12_4_;
                auVar51._12_4_ = fVar79 * fVar52;
                auVar47 = vcmpps_avx(auVar51,local_878,1);
                fVar52 = ray->tfar;
                auVar63._0_4_ = fVar64 * fVar52;
                auVar63._4_4_ = fVar65 * fVar52;
                auVar63._8_4_ = fVar66 * fVar52;
                auVar63._12_4_ = fVar79 * fVar52;
                auVar53 = vcmpps_avx(local_878,auVar63,2);
                auVar47 = vandps_avx(auVar53,auVar47);
                auVar53 = auVar80 & auVar47;
                if ((((auVar53 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                     (auVar53 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar53 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    auVar53[0xf] < '\0') {
                  local_848 = vandps_avx(auVar80,auVar47);
                  local_7e8 = local_a08._0_8_;
                  uStack_7e0 = local_a08._8_8_;
                  auVar80 = vrcpps_avx(local_868);
                  fVar52 = auVar80._0_4_;
                  auVar73._0_4_ = fVar64 * fVar52;
                  fVar64 = auVar80._4_4_;
                  auVar73._4_4_ = fVar65 * fVar64;
                  fVar65 = auVar80._8_4_;
                  auVar73._8_4_ = fVar66 * fVar65;
                  fVar66 = auVar80._12_4_;
                  auVar73._12_4_ = fVar79 * fVar66;
                  auVar77._8_4_ = 0x3f800000;
                  auVar77._0_8_ = &DAT_3f8000003f800000;
                  auVar77._12_4_ = 0x3f800000;
                  auVar80 = vsubps_avx(auVar77,auVar73);
                  fVar52 = fVar52 + fVar52 * auVar80._0_4_;
                  fVar64 = fVar64 + fVar64 * auVar80._4_4_;
                  fVar65 = fVar65 + fVar65 * auVar80._8_4_;
                  fVar66 = fVar66 + fVar66 * auVar80._12_4_;
                  local_818[0] = fVar52 * local_878._0_4_;
                  local_818[1] = fVar64 * local_878._4_4_;
                  local_818[2] = fVar65 * local_878._8_4_;
                  local_818[3] = fVar66 * local_878._12_4_;
                  local_838._0_4_ = fVar52 * local_898._0_4_;
                  local_838._4_4_ = fVar64 * local_898._4_4_;
                  local_838._8_4_ = fVar65 * local_898._8_4_;
                  local_838._12_4_ = fVar66 * local_898._12_4_;
                  local_828._0_4_ = fVar52 * local_888._0_4_;
                  local_828._4_4_ = fVar64 * local_888._4_4_;
                  local_828._8_4_ = fVar65 * local_888._8_4_;
                  local_828._12_4_ = fVar66 * local_888._12_4_;
                  uVar37 = vmovmskps_avx(local_848);
                  uVar36 = (ulong)uVar37;
                  do {
                    local_9c8 = 0;
                    if (uVar36 != 0) {
                      for (; (uVar36 >> local_9c8 & 1) == 0; local_9c8 = local_9c8 + 1) {
                      }
                    }
                    h.geomID = *(uint *)((long)&local_8a8 + local_9c8 * 4);
                    local_9d0 = (scene->geometries).items[h.geomID].ptr;
                    if ((local_9d0->mask & ray->mask) == 0) {
                      uVar36 = uVar36 ^ 1L << (local_9c8 & 0x3f);
                      bVar31 = true;
                    }
                    else if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                            (local_9d0->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
                      bVar31 = false;
                    }
                    else {
                      local_9f8._0_8_ = context->args;
                      local_a48._0_8_ = uVar36;
                      local_9e8._0_8_ = pNVar44;
                      h.u = *(float *)(local_838 + local_9c8 * 4);
                      h.v = local_818[local_9c8 - 4];
                      local_a08._0_8_ = context;
                      args.context = context->user;
                      h.primID = *(uint *)((long)&local_8b8 + local_9c8 * 4);
                      h.Ng.field_0.field_0.x = (float)*(undefined4 *)(local_808 + local_9c8 * 4);
                      h.Ng.field_0.field_0.y = (float)*(undefined4 *)(local_7f8 + local_9c8 * 4);
                      h.Ng.field_0.field_0.z = *(float *)((long)&local_7e8 + local_9c8 * 4);
                      h.instID[0] = (args.context)->instID[0];
                      h.instPrimID[0] = (args.context)->instPrimID[0];
                      fVar52 = ray->tfar;
                      ray->tfar = local_818[local_9c8];
                      local_a4c = -1;
                      args.valid = &local_a4c;
                      args.geometryUserPtr = local_9d0->userPtr;
                      args.hit = (RTCHitN *)&h;
                      args.N = 1;
                      args.ray = (RTCRayN *)ray;
                      if ((local_9d0->occlusionFilterN == (RTCFilterFunctionN)0x0) ||
                         ((*local_9d0->occlusionFilterN)(&args), *args.valid != 0)) {
                        if (*(code **)(local_9f8._0_8_ + 0x10) != (code *)0x0) {
                          if (((*(byte *)local_9f8._0_8_ & 2) != 0) ||
                             (((local_9d0->field_8).field_0x2 & 0x40) != 0)) {
                            (**(code **)(local_9f8._0_8_ + 0x10))(&args);
                          }
                          if (*args.valid == 0) goto LAB_002d6dbe;
                        }
                        bVar31 = false;
                      }
                      else {
LAB_002d6dbe:
                        ray->tfar = fVar52;
                        local_a48._0_8_ = local_a48._0_8_ ^ 1L << (local_9c8 & 0x3f);
                        bVar31 = true;
                      }
                      uVar36 = local_a48._0_8_;
                      context = (RayQueryContext *)local_a08._0_8_;
                      pNVar44 = (NodeRef *)local_9e8._0_8_;
                    }
                    if (!bVar31) {
                      uVar36 = local_a30;
                      uVar41 = local_a28;
                      uVar42 = local_a18;
                      uVar43 = local_a20;
                      if (bVar46) {
                        ray->tfar = -INFINITY;
                        iVar45 = 3;
                      }
                      goto LAB_002d6e6a;
                    }
                  } while (uVar36 != 0);
                }
              }
              uVar39 = uVar39 + 1;
              bVar46 = uVar39 < local_9b0;
              uVar36 = local_a30;
              uVar41 = local_a28;
              uVar42 = local_a18;
              uVar43 = local_a20;
            } while (uVar39 != local_9b0);
          }
        }
LAB_002d6e6a:
      } while (iVar45 != 3);
    }
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::occluded(const Accel::Intersectors* __restrict__ This,
                                                                             Ray& __restrict__ ray,
                                                                             RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
       
      /* early out for already occluded rays */
      if (unlikely(ray.tfar < 0.0f))
        return;

      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      NodeRef stack[stackSize];    // stack of nodes that still need to get traversed
      NodeRef* stackPtr = stack+1; // current stack pointer
      NodeRef* stackEnd = stack+stackSize;
      stack[0] = bvh->root;

      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif

      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = (NodeRef)*stackPtr;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(shadow.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(shadow.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        if (PrimitiveIntersector1::occluded(This, pre, ray, context, prim, num, tray, lazy_node)) {
          ray.tfar = neg_inf;
          break;
        }

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          *stackPtr = (NodeRef)lazy_node;
          stackPtr++;
        }
      }
    }